

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O0

void Cec_ManSimStop(Cec_ManSim_t *p)

{
  Cec_ManSim_t *p_local;
  
  Vec_IntFree(p->vClassOld);
  Vec_IntFree(p->vClassNew);
  Vec_IntFree(p->vClassTemp);
  Vec_IntFree(p->vRefinedC);
  if (p->vCiSimInfo != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCiSimInfo);
  }
  if (p->vCoSimInfo != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCoSimInfo);
  }
  if (p->pScores != (int *)0x0) {
    free(p->pScores);
    p->pScores = (int *)0x0;
  }
  if (p->pCexComb != (Abc_Cex_t *)0x0) {
    free(p->pCexComb);
    p->pCexComb = (Abc_Cex_t *)0x0;
  }
  if (p->pCexes != (void **)0x0) {
    free(p->pCexes);
    p->pCexes = (void **)0x0;
  }
  if (p->pMems != (uint *)0x0) {
    free(p->pMems);
    p->pMems = (uint *)0x0;
  }
  if (p->pSimInfo != (int *)0x0) {
    free(p->pSimInfo);
    p->pSimInfo = (int *)0x0;
  }
  if (p != (Cec_ManSim_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Cec_ManSimStop( Cec_ManSim_t * p )  
{
    Vec_IntFree( p->vClassOld );
    Vec_IntFree( p->vClassNew );
    Vec_IntFree( p->vClassTemp );
    Vec_IntFree( p->vRefinedC );
    if ( p->vCiSimInfo ) 
        Vec_PtrFree( p->vCiSimInfo );
    if ( p->vCoSimInfo ) 
        Vec_PtrFree( p->vCoSimInfo );
    ABC_FREE( p->pScores );
    ABC_FREE( p->pCexComb );
    ABC_FREE( p->pCexes );
    ABC_FREE( p->pMems );
    ABC_FREE( p->pSimInfo );
    ABC_FREE( p );
}